

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O2

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_component_info *pjVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  boolean bVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  jpeg_component_info *pjVar13;
  int iVar14;
  JDIMENSION *pJVar15;
  bool bVar16;
  
  iVar11 = cinfo->global_state;
  if (iVar11 != 0xca) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar11;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar5 = cinfo->scale_denom;
  uVar4 = cinfo->scale_num << 3;
  if (uVar5 < uVar4) {
    if (uVar5 * 2 < uVar4) {
      if (uVar5 * 3 < uVar4) {
        if (uVar5 * 4 < uVar4) {
          if (uVar5 * 5 < uVar4) {
            if (uVar5 * 6 < uVar4) {
              if (uVar5 * 7 < uVar4) {
                if (uVar5 * 8 < uVar4) {
                  if (uVar5 * 9 < uVar4) {
                    if (uVar5 * 10 < uVar4) {
                      if (uVar5 * 0xb < uVar4) {
                        if (uVar5 * 0xc < uVar4) {
                          if (uVar5 * 0xd < uVar4) {
                            if (uVar5 * 0xe < uVar4) {
                              if (uVar5 * 0xf < uVar4) {
                                lVar7 = jdiv_round_up((ulong)cinfo->image_width << 4,8);
                                cinfo->output_width = (JDIMENSION)lVar7;
                                lVar7 = jdiv_round_up((ulong)cinfo->image_height << 4,8);
                                cinfo->output_height = (JDIMENSION)lVar7;
                                cinfo->min_DCT_scaled_size = 0x10;
                                iVar11 = 0x10;
                              }
                              else {
                                lVar7 = jdiv_round_up((ulong)cinfo->image_width * 0xf,8);
                                cinfo->output_width = (JDIMENSION)lVar7;
                                lVar7 = jdiv_round_up((ulong)cinfo->image_height * 0xf,8);
                                cinfo->output_height = (JDIMENSION)lVar7;
                                cinfo->min_DCT_scaled_size = 0xf;
                                iVar11 = 0xf;
                              }
                            }
                            else {
                              lVar7 = jdiv_round_up((ulong)cinfo->image_width * 0xe,8);
                              cinfo->output_width = (JDIMENSION)lVar7;
                              lVar7 = jdiv_round_up((ulong)cinfo->image_height * 0xe,8);
                              cinfo->output_height = (JDIMENSION)lVar7;
                              cinfo->min_DCT_scaled_size = 0xe;
                              iVar11 = 0xe;
                            }
                          }
                          else {
                            lVar7 = jdiv_round_up((ulong)cinfo->image_width * 0xd,8);
                            cinfo->output_width = (JDIMENSION)lVar7;
                            lVar7 = jdiv_round_up((ulong)cinfo->image_height * 0xd,8);
                            cinfo->output_height = (JDIMENSION)lVar7;
                            cinfo->min_DCT_scaled_size = 0xd;
                            iVar11 = 0xd;
                          }
                        }
                        else {
                          lVar7 = jdiv_round_up((ulong)cinfo->image_width * 0xc,8);
                          cinfo->output_width = (JDIMENSION)lVar7;
                          lVar7 = jdiv_round_up((ulong)cinfo->image_height * 0xc,8);
                          cinfo->output_height = (JDIMENSION)lVar7;
                          cinfo->min_DCT_scaled_size = 0xc;
                          iVar11 = 0xc;
                        }
                      }
                      else {
                        lVar7 = jdiv_round_up((ulong)cinfo->image_width * 0xb,8);
                        cinfo->output_width = (JDIMENSION)lVar7;
                        lVar7 = jdiv_round_up((ulong)cinfo->image_height * 0xb,8);
                        cinfo->output_height = (JDIMENSION)lVar7;
                        cinfo->min_DCT_scaled_size = 0xb;
                        iVar11 = 0xb;
                      }
                    }
                    else {
                      lVar7 = jdiv_round_up((ulong)cinfo->image_width * 10,8);
                      cinfo->output_width = (JDIMENSION)lVar7;
                      lVar7 = jdiv_round_up((ulong)cinfo->image_height * 10,8);
                      cinfo->output_height = (JDIMENSION)lVar7;
                      cinfo->min_DCT_scaled_size = 10;
                      iVar11 = 10;
                    }
                  }
                  else {
                    lVar7 = jdiv_round_up((ulong)cinfo->image_width * 9,8);
                    cinfo->output_width = (JDIMENSION)lVar7;
                    lVar7 = jdiv_round_up((ulong)cinfo->image_height * 9,8);
                    cinfo->output_height = (JDIMENSION)lVar7;
                    cinfo->min_DCT_scaled_size = 9;
                    iVar11 = 9;
                  }
                }
                else {
                  lVar7 = jdiv_round_up((ulong)cinfo->image_width << 3,8);
                  cinfo->output_width = (JDIMENSION)lVar7;
                  lVar7 = jdiv_round_up((ulong)cinfo->image_height << 3,8);
                  cinfo->output_height = (JDIMENSION)lVar7;
                  cinfo->min_DCT_scaled_size = 8;
                  iVar11 = 8;
                }
              }
              else {
                lVar7 = jdiv_round_up((ulong)cinfo->image_width * 7,8);
                cinfo->output_width = (JDIMENSION)lVar7;
                lVar7 = jdiv_round_up((ulong)cinfo->image_height * 7,8);
                cinfo->output_height = (JDIMENSION)lVar7;
                cinfo->min_DCT_scaled_size = 7;
                iVar11 = 7;
              }
            }
            else {
              lVar7 = jdiv_round_up((ulong)cinfo->image_width * 6,8);
              cinfo->output_width = (JDIMENSION)lVar7;
              lVar7 = jdiv_round_up((ulong)cinfo->image_height * 6,8);
              cinfo->output_height = (JDIMENSION)lVar7;
              cinfo->min_DCT_scaled_size = 6;
              iVar11 = 6;
            }
          }
          else {
            lVar7 = jdiv_round_up((ulong)cinfo->image_width * 5,8);
            cinfo->output_width = (JDIMENSION)lVar7;
            lVar7 = jdiv_round_up((ulong)cinfo->image_height * 5,8);
            cinfo->output_height = (JDIMENSION)lVar7;
            cinfo->min_DCT_scaled_size = 5;
            iVar11 = 5;
          }
        }
        else {
          lVar7 = jdiv_round_up((ulong)cinfo->image_width << 2,8);
          cinfo->output_width = (JDIMENSION)lVar7;
          lVar7 = jdiv_round_up((ulong)cinfo->image_height << 2,8);
          cinfo->output_height = (JDIMENSION)lVar7;
          cinfo->min_DCT_scaled_size = 4;
          iVar11 = 4;
        }
      }
      else {
        lVar7 = jdiv_round_up((ulong)cinfo->image_width * 3,8);
        cinfo->output_width = (JDIMENSION)lVar7;
        lVar7 = jdiv_round_up((ulong)cinfo->image_height * 3,8);
        cinfo->output_height = (JDIMENSION)lVar7;
        cinfo->min_DCT_scaled_size = 3;
        iVar11 = 3;
      }
    }
    else {
      lVar7 = jdiv_round_up((ulong)cinfo->image_width * 2,8);
      cinfo->output_width = (JDIMENSION)lVar7;
      lVar7 = jdiv_round_up((ulong)cinfo->image_height * 2,8);
      cinfo->output_height = (JDIMENSION)lVar7;
      cinfo->min_DCT_scaled_size = 2;
      iVar11 = 2;
    }
  }
  else {
    iVar11 = 1;
    lVar7 = jdiv_round_up((ulong)cinfo->image_width,8);
    cinfo->output_width = (JDIMENSION)lVar7;
    lVar7 = jdiv_round_up((ulong)cinfo->image_height,8);
    cinfo->output_height = (JDIMENSION)lVar7;
    cinfo->min_DCT_scaled_size = 1;
  }
  pjVar2 = cinfo->comp_info;
  iVar9 = cinfo->num_components;
  iVar12 = 0;
  if (0 < iVar9) {
    iVar12 = iVar9;
  }
  piVar8 = &pjVar2->DCT_scaled_size;
  iVar10 = iVar12;
  while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
    *piVar8 = iVar11;
    piVar8 = piVar8 + 0x18;
  }
  iVar10 = 0;
  pjVar13 = pjVar2;
  do {
    iVar3 = iVar11;
    if (iVar10 == iVar12) {
      pJVar15 = &pjVar2->downsampled_height;
      for (iVar11 = 0; iVar11 < iVar9; iVar11 = iVar11 + 1) {
        lVar7 = jdiv_round_up((long)(int)pJVar15[-2] * (long)(int)pJVar15[-9] *
                              (ulong)cinfo->image_width,(long)cinfo->max_h_samp_factor << 3);
        pJVar15[-1] = (JDIMENSION)lVar7;
        lVar7 = jdiv_round_up((long)(int)pJVar15[-2] * (long)(int)pJVar15[-8] *
                              (ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
        *pJVar15 = (JDIMENSION)lVar7;
        iVar9 = cinfo->num_components;
        pJVar15 = pJVar15 + 0x18;
      }
      uVar5 = cinfo->out_color_space - JCS_GRAYSCALE;
      if (uVar5 < 0x10) {
        iVar9 = *(int *)(&DAT_00172ce4 + (ulong)uVar5 * 4);
      }
      cinfo->out_color_components = iVar9;
      iVar11 = 1;
      if (cinfo->quantize_colors != 0) {
        iVar9 = iVar11;
      }
      cinfo->output_components = iVar9;
      bVar6 = use_merged_upsample(cinfo);
      if (bVar6 != 0) {
        iVar11 = cinfo->max_v_samp_factor;
      }
      cinfo->rec_outbuf_height = iVar11;
      return;
    }
    do {
      iVar14 = iVar3;
      if ((7 < iVar14) ||
         (iVar3 = iVar14 * 2,
         (cinfo->max_h_samp_factor * iVar11) % (pjVar13->h_samp_factor * iVar3) != 0)) break;
    } while ((cinfo->max_v_samp_factor * iVar11) % (pjVar13->v_samp_factor * iVar3) == 0);
    pjVar13->DCT_scaled_size = iVar14;
    iVar10 = iVar10 + 1;
    pjVar13 = pjVar13 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions(j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = cinfo->_min_DCT_scaled_size;
    while (ssize < DCTSIZE &&
           ((cinfo->max_h_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->h_samp_factor * ssize * 2) == 0) &&
           ((cinfo->max_v_samp_factor * cinfo->_min_DCT_scaled_size) %
            (compptr->v_samp_factor * ssize * 2) == 0)) {
      ssize = ssize * 2;
    }
#if JPEG_LIB_VERSION >= 70
    compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size = ssize;
#else
    compptr->DCT_scaled_size = ssize;
#endif
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_width *
                    (long)(compptr->h_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long)cinfo->image_height *
                    (long)(compptr->v_samp_factor * compptr->_DCT_scaled_size),
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));
  }

#else /* !IDCT_SCALING_SUPPORTED */

  /* Hardwire it to "no scaling" */
  cinfo->output_width = cinfo->image_width;
  cinfo->output_height = cinfo->image_height;
  /* jdinput.c has already initialized DCT_scaled_size to DCTSIZE,
   * and has computed unscaled downsampled_width and downsampled_height.
   */

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    cinfo->out_color_components = rgb_pixelsize[cinfo->out_color_space];
    break;
  case JCS_YCbCr:
  case JCS_RGB565:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:                      /* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
                              cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}